

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CMainMethod *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  CMainMethod *stm_local;
  CConvertVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->returnType);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->(&stm->returnType);
    (**(pCVar2->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"public static void main");
  std::__cxx11::string::operator+=((string *)&this->code,"(String[] ");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->args);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->args);
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,") {\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->vars);
  if (bVar1) {
    pCVar4 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->(&stm->vars);
    (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->statements);
  if (bVar1) {
    pCVar5 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::operator->
                       (&stm->statements);
    (**(pCVar5->super_IStatement).super_PositionedNode.super_INode._vptr_INode)(pCVar5,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"}\n\n");
  return;
}

Assistant:

void CConvertVisitor::Visit(CMainMethod &stm) {
	if (stm.returnType) {
		stm.returnType->Accept(*this);
	}
	this->code += "public static void main";
	this->code += "(String[] ";
	if (stm.args) {
		stm.args->Accept(*this);
	}
	this->code += ") {\n";
	if (stm.vars) {
		stm.vars->Accept(*this);
	}
	if (stm.statements) {
		stm.statements->Accept(*this);
	}
	this->code += "}\n\n";
}